

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

bool goodform::convert<int>(any *v,int *dest)

{
  bool bVar1;
  char *pcVar2;
  short *psVar3;
  int *piVar4;
  long *plVar5;
  byte *pbVar6;
  unsigned_short *puVar7;
  uint *puVar8;
  unsigned_long *puVar9;
  float *pfVar10;
  double *pdVar11;
  int *dest_local;
  any *v_local;
  
  bVar1 = can_be<int>(v);
  if (bVar1) {
    bVar1 = is<signed_char>(v);
    if (bVar1) {
      pcVar2 = get<signed_char>(v);
      *dest = (int)*pcVar2;
    }
    else {
      bVar1 = is<short>(v);
      if (bVar1) {
        psVar3 = get<short>(v);
        *dest = (int)*psVar3;
      }
      else {
        bVar1 = is<int>(v);
        if (bVar1) {
          piVar4 = get<int>(v);
          *dest = *piVar4;
        }
        else {
          bVar1 = is<long>(v);
          if (bVar1) {
            plVar5 = get<long>(v);
            *dest = (int)*plVar5;
          }
          else {
            bVar1 = is<unsigned_char>(v);
            if (bVar1) {
              pbVar6 = get<unsigned_char>(v);
              *dest = (uint)*pbVar6;
            }
            else {
              bVar1 = is<unsigned_short>(v);
              if (bVar1) {
                puVar7 = get<unsigned_short>(v);
                *dest = (uint)*puVar7;
              }
              else {
                bVar1 = is<unsigned_int>(v);
                if (bVar1) {
                  puVar8 = get<unsigned_int>(v);
                  *dest = *puVar8;
                }
                else {
                  bVar1 = is<unsigned_long>(v);
                  if (bVar1) {
                    puVar9 = get<unsigned_long>(v);
                    *dest = (int)*puVar9;
                  }
                  else {
                    bVar1 = is<float>(v);
                    if (bVar1) {
                      pfVar10 = get<float>(v);
                      *dest = (int)*pfVar10;
                    }
                    else {
                      bVar1 = is<double>(v);
                      if (bVar1) {
                        pdVar11 = get<double>(v);
                        *dest = (int)*pdVar11;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    v_local._7_1_ = true;
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

bool convert(const any& v, T& dest)
  {
    if (can_be<T>(v))
    {
      if (is<std::int8_t>(v))        dest = T(get<std::int8_t>(v));
      else if (is<std::int16_t>(v))  dest = T(get<std::int16_t>(v));
      else if (is<std::int32_t>(v))  dest = T(get<std::int32_t>(v));
      else if (is<std::int64_t>(v))  dest = T(get<std::int64_t>(v));
      else if (is<std::uint8_t>(v))  dest = T(get<std::uint8_t>(v));
      else if (is<std::uint16_t>(v)) dest = T(get<std::uint16_t>(v));
      else if (is<std::uint32_t>(v)) dest = T(get<std::uint32_t>(v));
      else if (is<std::uint64_t>(v)) dest = T(get<std::uint64_t>(v));
      else if (is<float>(v))         dest = T(get<float>(v));
      else if (is<double>(v))        dest = T(get<double>(v));
      return true;
    }
    return false;
  }